

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O2

FieldInfo __thiscall QDateTimeParser::fieldInfo(QDateTimeParser *this,int index)

{
  Section SVar1;
  long lVar2;
  QFlagsStorage<QDateTimeParser::FieldInfoFlag> QVar3;
  SectionNode *this_00;
  ushort *puVar4;
  QFlagsStorage<QDateTimeParser::FieldInfoFlag> QVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QMessageLogger local_60;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = sectionNode(this,index);
  SVar1 = this_00->type;
  switch(SVar1) {
  case AmPmSection:
    getAmPmText((QString *)&local_60,this,AmText,this_00->count);
    lVar2 = CONCAT44(local_60.context.function._4_4_,local_60.context.function._0_4_);
    getAmPmText((QString *)&local_40,this,PmText,this_00->count);
    bVar6 = lVar2 == local_40.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
LAB_003be9d3:
    QVar5.i = (uint)bVar6 * 2;
    goto LAB_003be9e9;
  case MSecSection:
    QVar3.i = 0xd;
    break;
  case MSecSection|AmPmSection:
  case SecondSection|AmPmSection:
  case SecondSection|MSecSection:
  case SecondSection|MSecSection|AmPmSection:
switchD_003be8ec_caseD_3:
    local_60.context.version = 2;
    local_60.context.function._4_4_ = 0;
    local_60.context._4_8_ = 0;
    local_60.context.file._4_4_ = 0;
    local_60.context.function._0_4_ = 0;
    local_60.context.category = "default";
    SectionNode::name((QString *)&local_40,this_00);
    puVar4 = QString::utf16((QString *)&local_40);
    QMessageLogger::warning
              (&local_60,"QDateTimeParser::fieldInfo Internal error 2 (%d %ls %d)",index,puVar4,
               (ulong)(uint)this_00->count);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    QVar5.i = 0;
    goto LAB_003be9e9;
  default:
    if ((SVar1 != Hour12Section) && (SVar1 != Hour24Section)) {
      if (SVar1 == TimeZoneSection) {
        QVar5.i = 0;
        goto LAB_003be9e9;
      }
      if ((SVar1 == DaySection) || (SVar1 == MonthSection)) {
        QVar5.i = 7;
        if (this_00->count != 2) {
          QVar5.i = (uint)(this_00->count == 1) * 5;
        }
        goto LAB_003be9e9;
      }
      if (SVar1 == YearSection) {
        QVar3.i = 1;
        break;
      }
      if (SVar1 != YearSection2Digits) {
        if ((SVar1 != DayOfWeekSectionShort) && (SVar1 != DayOfWeekSectionLong))
        goto switchD_003be8ec_caseD_3;
        bVar6 = this_00->count == 3;
        goto LAB_003be9d3;
      }
    }
  case SecondSection:
  case MinuteSection:
    QVar3.i = 5;
  }
  QVar5.i = QVar3.i | 2;
  if (this_00->count == 1) {
    QVar5.i = QVar3.i;
  }
LAB_003be9e9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (QFlagsStorageHelper<QDateTimeParser::FieldInfoFlag,_4>)
         (QFlagsStorageHelper<QDateTimeParser::FieldInfoFlag,_4>)QVar5.i;
}

Assistant:

QDateTimeParser::FieldInfo QDateTimeParser::fieldInfo(int index) const
{
    FieldInfo ret;
    const SectionNode &sn = sectionNode(index);
    switch (sn.type) {
    case MSecSection:
        ret |= Fraction;
        Q_FALLTHROUGH();
    case SecondSection:
    case MinuteSection:
    case Hour24Section:
    case Hour12Section:
    case YearSection2Digits:
        ret |= AllowPartial;
        Q_FALLTHROUGH();
    case YearSection:
        ret |= Numeric;
        if (sn.count != 1)
            ret |= FixedWidth;
        break;
    case MonthSection:
    case DaySection:
        switch (sn.count) {
        case 2:
            ret |= FixedWidth;
            Q_FALLTHROUGH();
        case 1:
            ret |= (Numeric|AllowPartial);
            break;
        }
        break;
    case DayOfWeekSectionShort:
    case DayOfWeekSectionLong:
        if (sn.count == 3)
            ret |= FixedWidth;
        break;
    case AmPmSection:
        // Some locales have different length AM and PM texts.
        if (getAmPmText(AmText, Case(sn.count)).size()
            == getAmPmText(PmText, Case(sn.count)).size()) {
            // Only relevant to DateTimeEdit's fixups in parse().
            ret |= FixedWidth;
        }
        break;
    case TimeZoneSection:
        break;
    default:
        qWarning("QDateTimeParser::fieldInfo Internal error 2 (%d %ls %d)",
                 index, qUtf16Printable(sn.name()), sn.count);
        break;
    }
    return ret;
}